

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

uint get_max_prime(uint number)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint i;
  ulong uVar4;
  
  uVar4 = (ulong)number;
  if (1 < number) {
    if (number != 2) {
      do {
        number = (uint)uVar4;
        if ((uVar4 & 1) != 0) {
          uVar3 = 3;
          do {
            if (number == uVar3) goto LAB_001039c9;
            uVar1 = (ulong)uVar3;
            uVar3 = uVar3 + 1;
          } while ((int)(uVar4 % uVar1) != 0);
        }
        uVar4 = (ulong)(number - 1);
      } while (2 < number - 1);
    }
    number = 1;
  }
LAB_001039c9:
  uVar2 = 2;
  if (2 < number) {
    uVar2 = number;
  }
  return uVar2;
}

Assistant:

uint get_max_prime(unsigned int number) {
    for (unsigned int i = number; i >= 2; --i) {
        for (int j = 2; j < i; ++j) {
            if (i % j == 0)
                break;
            if (j == i - 1)
                return i;
        }
    }
    return 2;
}